

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_junit_xml_generator.hpp
# Opt level: O0

bool iutest::JunitXmlGeneratorListener::SetUp(void)

{
  ulong uVar1;
  TestEventListeners *this;
  JunitXmlGeneratorListener *this_00;
  undefined1 local_30 [8];
  string xmlpath;
  
  TestEnv::get_report_junit_xml_filepath_abi_cxx11_();
  uVar1 = std::__cxx11::string::empty();
  xmlpath.field_2._M_local_buf[0xf] = (uVar1 & 1) == 0;
  if ((bool)xmlpath.field_2._M_local_buf[0xf]) {
    this = TestEnv::event_listeners();
    this_00 = (JunitXmlGeneratorListener *)operator_new(0x50);
    JunitXmlGeneratorListener(this_00,(string *)local_30);
    TestEventListeners::set_default_xml_generator(this,(TestEventListener *)this_00);
  }
  std::__cxx11::string::~string((string *)local_30);
  return (bool)(xmlpath.field_2._M_local_buf[0xf] & 1);
}

Assistant:

static bool SetUp()
    {
        ::std::string xmlpath = TestEnv::get_report_junit_xml_filepath();
        if( !xmlpath.empty() )
        {
            TestEnv::event_listeners().set_default_xml_generator(new JunitXmlGeneratorListener(xmlpath));
            return true;
        }
        return false;
    }